

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gain_calculator_direct_speakers.cpp
# Opt level: O3

vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> * __thiscall
ear::GainCalculatorDirectSpeakersImpl::_findCandidates
          (vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
           *__return_storage_ptr__,GainCalculatorDirectSpeakersImpl *this,
          CartesianSpeakerPosition *pos,bool isLfe,double tol)

{
  pointer *pppVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  type tVar6;
  pointer pCVar7;
  _Alloc_hider _Var8;
  ulong uVar9;
  long lVar10;
  iterator __position;
  vector<ear::Channel,_std::allocator<ear::Channel>_> *pvVar11;
  long lVar12;
  long lVar13;
  double *pdVar14;
  CartesianSpeakerPosition *pCVar15;
  long lVar16;
  bool bVar17;
  bool bVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  Channel channel;
  RowVector3d cartPosition;
  double local_1f8;
  double local_1e8;
  pair<int,_double> local_1c8;
  long *local_1b8;
  double dStack_1b0;
  long local_1a8 [2];
  double local_198;
  double dStack_190;
  double local_188;
  char local_180;
  type local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  char local_160;
  type local_158;
  undefined8 uStack_150;
  byte local_148;
  type local_140;
  undefined8 uStack_138;
  undefined1 local_130;
  long *local_128;
  double dStack_120;
  long *local_118;
  double dStack_110;
  long local_108;
  undefined1 local_f8 [128];
  dummy_u local_78;
  bool local_58;
  dummy_u local_50;
  
  pCVar15 = pos;
  pdVar14 = (double *)local_f8;
  for (lVar13 = 0xf; lVar13 != 0; lVar13 = lVar13 + -1) {
    *pdVar14 = pCVar15->X;
    pCVar15 = (CartesianSpeakerPosition *)&pCVar15->XMin;
    pdVar14 = pdVar14 + 1;
  }
  local_f8[0x78] = false;
  bVar17 = (pos->screenEdgeLock).horizontal.super_type.m_initialized == true;
  if (bVar17) {
    local_78.aligner_ = (type)((long)local_f8 + 0x90);
    tVar6 = (pos->screenEdgeLock).horizontal.super_type.m_storage.dummy_.aligner_;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_f8 + 0x80),tVar6,
               *(long *)((long)&(pos->screenEdgeLock).horizontal.super_type.m_storage.dummy_ + 8) +
               (long)tVar6);
  }
  local_58 = false;
  bVar18 = (pos->screenEdgeLock).vertical.super_type.m_initialized == true;
  local_f8[0x78] = bVar17;
  if (bVar18) {
    local_50.aligner_ = (type)((long)local_f8 + 0xb8);
    tVar6 = (pos->screenEdgeLock).vertical.super_type.m_storage.dummy_.aligner_;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_f8 + 0xa8),tVar6,
               *(long *)((long)&(pos->screenEdgeLock).vertical.super_type.m_storage.dummy_ + 8) +
               (long)tVar6);
  }
  local_58 = bVar18;
  toCartesianVector3d((CartesianSpeakerPosition *)local_f8);
  local_128 = local_1b8;
  dStack_120 = dStack_1b0;
  local_118 = local_1b8;
  dStack_110 = dStack_1b0;
  local_108 = local_1a8[0];
  if (local_58 == true) {
    if (local_50.aligner_ != (type)((long)local_f8 + 0xb8)) {
      operator_delete((void *)local_50.aligner_,local_50._16_8_ + 1);
    }
    local_58 = false;
  }
  if (local_f8[0x78] == true) {
    if (local_78.aligner_ != (type)((long)local_f8 + 0x90)) {
      operator_delete((void *)local_78.aligner_,local_78._16_8_ + 1);
    }
    local_f8[0x78] = false;
  }
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1e8 = pos->Y;
  uVar19 = SUB84(local_1e8,0);
  uVar21 = (undefined4)((ulong)local_1e8 >> 0x20);
  if ((pos->YMin).super_type.m_initialized != false) {
    dVar3 = (pos->YMin).super_type.m_storage;
    uVar19 = SUB84(dVar3,0);
    uVar21 = (undefined4)((ulong)dVar3 >> 0x20);
  }
  if ((pos->YMax).super_type.m_initialized != false) {
    local_1e8 = (pos->YMax).super_type.m_storage;
  }
  local_1f8 = pos->Z;
  uVar20 = SUB84(local_1f8,0);
  uVar22 = (undefined4)((ulong)local_1f8 >> 0x20);
  if ((pos->ZMin).super_type.m_initialized != false) {
    dVar3 = (pos->ZMin).super_type.m_storage;
    uVar20 = SUB84(dVar3,0);
    uVar22 = (undefined4)((ulong)dVar3 >> 0x20);
  }
  if ((pos->ZMax).super_type.m_initialized != false) {
    local_1f8 = (pos->ZMax).super_type.m_storage;
  }
  if (0 < this->_nChannels) {
    dVar3 = (&pos->X)[(ulong)(pos->XMin).super_type.m_initialized * 2];
    dVar4 = (&pos->X)[(ulong)(pos->XMax).super_type.m_initialized * 4];
    lVar16 = 0;
    lVar13 = 0;
    do {
      pvVar11 = Layout::channels(&this->_layout);
      local_1b8 = local_1a8;
      pCVar7 = (pvVar11->super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>)._M_impl.
               super__Vector_impl_data._M_start;
      _Var8._M_p = pCVar7[lVar13]._name._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1b8,_Var8._M_p,_Var8._M_p + pCVar7[lVar13]._name._M_string_length)
      ;
      local_188 = pCVar7[lVar13]._polarPosition.distance;
      local_198 = pCVar7[lVar13]._polarPosition.azimuth;
      dStack_190 = pCVar7[lVar13]._polarPosition.elevation;
      local_180 = pCVar7[lVar13]._polarPositionNominal.super_type.m_initialized == true;
      if ((bool)local_180) {
        local_168 = *(undefined8 *)
                     ((long)&pCVar7[lVar13]._polarPositionNominal.super_type.m_storage + 0x10);
        local_178 = pCVar7[lVar13]._polarPositionNominal.super_type.m_storage.dummy_.aligner_;
        uStack_170 = *(undefined8 *)
                      ((long)&pCVar7[lVar13]._polarPositionNominal.super_type.m_storage + 8);
      }
      local_160 = pCVar7[lVar13]._azimuthRange.super_type.m_initialized == true;
      if ((bool)local_160) {
        local_158 = pCVar7[lVar13]._azimuthRange.super_type.m_storage.dummy_.aligner_;
        uStack_150 = *(undefined8 *)((long)&pCVar7[lVar13]._azimuthRange.super_type.m_storage + 8);
      }
      local_148 = pCVar7[lVar13]._elevationRange.super_type.m_initialized == true;
      if ((bool)local_148) {
        local_140 = pCVar7[lVar13]._elevationRange.super_type.m_storage.dummy_.aligner_;
        uStack_138 = *(undefined8 *)((long)&pCVar7[lVar13]._elevationRange.super_type.m_storage + 8)
        ;
      }
      local_130 = pCVar7[lVar13]._isLfe;
      if ((this->_isLfe).super_PlainObjectBase<Eigen::Array<bool,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows <= lVar13) {
        __assert_fail("index >= 0 && index < size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/DenseCoeffsBase.h"
                      ,0x19a,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Array<bool, -1, 1>, 1>::operator[](Index) [Derived = Eigen::Array<bool, -1, 1>, Level = 1]"
                     );
      }
      if ((this->_isLfe).super_PlainObjectBase<Eigen::Array<bool,__1,_1,_0,__1,_1>_>.m_storage.
          m_data[lVar13] == isLfe) {
        pdVar14 = (this->_positions).
                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data;
        uVar9 = (this->_positions).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_cols;
        if ((long)uVar9 < 0 && pdVar14 != (double *)0x0) {
          __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/MapBase.h"
                        ,0xb2,
                        "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>, Level = 0]"
                       );
        }
        lVar10 = (this->_positions).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                 .m_storage.m_rows;
        if (lVar10 <= lVar13) {
          __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/Block.h"
                        ,0x7a,
                        "Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = 1, BlockCols = -1, InnerPanel = false]"
                       );
        }
        if ((long)uVar9 < 1) {
LAB_0015fbdc:
          __assert_fail("index >= 0 && index < size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/DenseCoeffsBase.h"
                        ,0x1ab,
                        "Scalar &Eigen::DenseCoeffsBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>, 1>::operator()(Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>, Level = 1]"
                       );
        }
        pdVar2 = pdVar14 + lVar13;
        dVar5 = *pdVar2;
        if ((dVar3 <= dVar5 + tol) && (dVar5 - tol <= dVar4)) {
          if (uVar9 == 1) goto LAB_0015fbdc;
          if (((double)CONCAT44(uVar21,uVar19) <= pdVar2[lVar10] + tol) &&
             (pdVar2[lVar10] - tol <= local_1e8)) {
            if (uVar9 < 3) goto LAB_0015fbdc;
            if (((double)CONCAT44(uVar22,uVar20) <= pdVar2[lVar10 * 2] + tol) &&
               (pdVar2[lVar10 * 2] - tol <= local_1f8)) {
              if (uVar9 != 3) {
                __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                              "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/CwiseBinaryOp.h"
                              ,0x74,
                              "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>, const Eigen::Matrix<double, 1, 3>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Block<Eigen::Matrix<double, -1, -1>, 1>, Rhs = const Eigen::Matrix<double, 1, 3>]"
                             );
              }
              local_1c8.second = (dVar5 - (double)local_128) * (dVar5 - (double)local_128);
              pdVar14 = (double *)((long)pdVar14 + lVar16 + lVar10 * 8);
              lVar12 = 0;
              do {
                local_1c8.second =
                     local_1c8.second +
                     (*pdVar14 - (&dStack_110)[lVar12]) * (*pdVar14 - (&dStack_110)[lVar12]);
                lVar12 = lVar12 + 1;
                pdVar14 = pdVar14 + lVar10;
              } while (lVar12 != 2);
              local_1c8.second = SQRT(local_1c8.second);
              local_1c8.first = (int)lVar13;
              __position._M_current =
                   (__return_storage_ptr__->
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
              if (__position._M_current ==
                  (__return_storage_ptr__->
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>::
                _M_realloc_insert<std::pair<int,double>>
                          ((vector<std::pair<int,double>,std::allocator<std::pair<int,double>>> *)
                           __return_storage_ptr__,__position,&local_1c8);
              }
              else {
                *(ulong *)__position._M_current = CONCAT44(local_1c8._4_4_,local_1c8.first);
                (__position._M_current)->second = local_1c8.second;
                pppVar1 = &(__return_storage_ptr__->
                           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish;
                *pppVar1 = *pppVar1 + 1;
              }
            }
          }
        }
      }
      if ((local_148 & 1) != 0) {
        local_148 = 0;
      }
      if (local_160 == '\x01') {
        local_160 = '\0';
      }
      if (local_180 == '\x01') {
        local_180 = '\0';
      }
      if (local_1b8 != local_1a8) {
        operator_delete(local_1b8,local_1a8[0] + 1);
      }
      lVar13 = lVar13 + 1;
      lVar16 = lVar16 + 8;
    } while (lVar13 < this->_nChannels);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<int, double>>
  GainCalculatorDirectSpeakersImpl::_findCandidates(
      const CartesianSpeakerPosition& pos, bool isLfe, double tol) {
    Eigen::RowVector3d cartPosition = toCartesianVector3d(pos);
    std::vector<std::pair<int, double>> candidates;

    double XMin = boost::get_optional_value_or(pos.XMin, pos.X);
    double XMax = boost::get_optional_value_or(pos.XMax, pos.X);
    double YMin = boost::get_optional_value_or(pos.YMin, pos.Y);
    double YMax = boost::get_optional_value_or(pos.YMax, pos.Y);
    double ZMin = boost::get_optional_value_or(pos.ZMin, pos.Z);
    double ZMax = boost::get_optional_value_or(pos.ZMax, pos.Z);
    for (int i = 0; i < _nChannels; ++i) {
      Channel channel = _layout.channels()[i];
      if (isLfe == _isLfe[i]) {
        if (_positions.row(i)(0) + tol >= XMin &&
            _positions.row(i)(0) - tol <= XMax &&
            _positions.row(i)(1) + tol >= YMin &&
            _positions.row(i)(1) - tol <= YMax &&
            _positions.row(i)(2) + tol >= ZMin &&
            _positions.row(i)(2) - tol <= ZMax) {
          double distance = (_positions.row(i) - cartPosition).norm();
          candidates.push_back(std::make_pair(i, distance));
        }
      }
    }
    return candidates;
  }